

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.h
# Opt level: O2

uint64_t farmhash_len_16(uint64_t u,uint64_t v)

{
  ulong uVar1;
  
  uVar1 = (u ^ v) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ v ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

static inline uint64_t farmhash128_to_64(uint128_c_t x) {
  // Murmur-inspired hashing.
  const uint64_t k_mul = 0x9ddfea08eb382d69ULL;
  uint64_t a = (uint128_c_t_low64(x) ^ uint128_c_t_high64(x)) * k_mul;
  a ^= (a >> 47);
  uint64_t b = (uint128_c_t_high64(x) ^ a) * k_mul;
  b ^= (b >> 47);
  b *= k_mul;
  return b;
}